

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::JsonReporter::assertionEnded(JsonReporter *this,AssertionStats *assertionStats)

{
  byte bVar1;
  _Elt_pointer pJVar2;
  char *pcVar3;
  StringRef value;
  StringRef value_00;
  JsonObjectWriter assertionObject;
  JsonObjectWriter local_1c0;
  undefined1 local_1a8 [408];
  
  pJVar2 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonArrayWriter::writeObject(&local_1c0,pJVar2 + -1);
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)&local_1c0,"kind",4);
  value.m_size = 9;
  value.m_start = "assertion";
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1a8,value,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  local_1a8._0_8_ = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_1a8._8_8_ = (assertionStats->assertionResult).m_info.lineInfo.line;
  anon_unknown_26::writeSourceInfo(&local_1c0,(SourceLineInfo *)local_1a8);
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)&local_1c0,"status",6);
  bVar1 = (byte)(((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) >> 3) |
          ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok;
  pcVar3 = "false";
  if (bVar1 != 0) {
    pcVar3 = "true";
  }
  value_00.m_size = (ulong)bVar1 ^ 5;
  value_00.m_start = pcVar3;
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1a8,value_00,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  JsonObjectWriter::~JsonObjectWriter(&local_1c0);
  return;
}

Assistant:

void JsonReporter::assertionEnded( AssertionStats const& assertionStats ) {
        // TODO: There is lot of different things to handle here, but
        //       we can fill it in later, after we show that the basic
        //       outline and streaming reporter impl works well enough.
        //if ( !m_config->includeSuccessfulResults()
        //    && assertionStats.assertionResult.isOk() ) {
        //    return;
        //}
        assert( isInside( Writer::Array ) );
        auto assertionObject = m_arrayWriters.top().writeObject();

        assertionObject.write( "kind"_sr ).write( "assertion"_sr );
        writeSourceInfo( assertionObject,
                         assertionStats.assertionResult.getSourceInfo() );
        assertionObject.write( "status"_sr )
            .write( assertionStats.assertionResult.isOk() );
        // TODO: handling of result.
        // TODO: messages
        // TODO: totals?
    }